

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O3

int Col_ListIterMoveTo(ColListIterator *it,size_t index)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = it->index;
  if (uVar1 < index) {
    iVar2 = Col_ListIterForward(it,index - uVar1);
    return iVar2;
  }
  if (uVar1 >= index && uVar1 - index != 0) {
    Col_ListIterBackward(it,uVar1 - index);
  }
  return 0;
}

Assistant:

int
Col_ListIterMoveTo(
    Col_ListIterator it,    /*!< The iterator to move. */
    size_t index)           /*!< Position to move to. */
{
    if (index > it->index) {
        return Col_ListIterForward(it, index - it->index);
    } else if (index < it->index) {
        Col_ListIterBackward(it, it->index - index);
        return 0;
    } else {
        return 0;
    }
}